

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.h
# Opt level: O1

shared_ptr<chrono::fea::ChNodeFEAbase> __thiscall
chrono::fea::ChElementShellANCF_3833::GetNodeN(ChElementShellANCF_3833 *this,int n)

{
  _func_int **pp_Var1;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  shared_ptr<chrono::fea::ChNodeFEAbase> sVar3;
  shared_ptr<chrono::fea::ChNodeFEAbase> sVar4;
  
  _Var2._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (CONCAT44(in_register_00000034,n) + 0x60);
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       _Var2._M_pi[in_EDX]._vptr__Sp_counted_base;
  pp_Var1 = *(_func_int ***)&_Var2._M_pi[in_EDX]._M_use_count;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock = pp_Var1;
  if (pp_Var1 != (_func_int **)0x0) {
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      sVar3.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar3.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<chrono::fea::ChNodeFEAbase>)
             sVar3.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    UNLOCK();
  }
  sVar4.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar4.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::fea::ChNodeFEAbase>)
         sVar4.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChNodeFEAbase> GetNodeN(int n) override { return m_nodes[n]; }